

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ColumnSetExpr(Parse *pParse,Table *pTab,Column *pCol,Expr *pExpr)

{
  ExprList *pEVar1;
  char *in_RCX;
  long in_RDX;
  long in_RSI;
  ExprList *pList;
  Expr *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar2;
  Parse *pParse_00;
  
  pParse_00 = *(Parse **)(in_RSI + 0x50);
  if (((*(short *)(in_RDX + 0xc) == 0) || (pParse_00 == (Parse *)0x0)) ||
     (*(int *)&pParse_00->db < (int)(uint)*(ushort *)(in_RDX + 0xc))) {
    if (pParse_00 == (Parse *)0x0) {
      iVar2 = 1;
    }
    else {
      iVar2 = *(int *)&pParse_00->db + 1;
    }
    *(short *)(in_RDX + 0xc) = (short)iVar2;
    pEVar1 = sqlite3ExprListAppend
                       (pParse_00,(ExprList *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffc8);
    *(ExprList **)(in_RSI + 0x50) = pEVar1;
  }
  else {
    sqlite3ExprDelete((sqlite3 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffc8);
    (&pParse_00->zErrMsg)[(long)(int)(*(ushort *)(in_RDX + 0xc) - 1) * 3] = in_RCX;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ColumnSetExpr(
  Parse *pParse,    /* Parsing context */
  Table *pTab,      /* The table containing the column */
  Column *pCol,     /* The column to receive the new DEFAULT expression */
  Expr *pExpr       /* The new default expression */
){
  ExprList *pList;
  assert( IsOrdinaryTable(pTab) );
  pList = pTab->u.tab.pDfltList;
  if( pCol->iDflt==0
   || NEVER(pList==0)
   || NEVER(pList->nExpr<pCol->iDflt)
  ){
    pCol->iDflt = pList==0 ? 1 : pList->nExpr+1;
    pTab->u.tab.pDfltList = sqlite3ExprListAppend(pParse, pList, pExpr);
  }else{
    sqlite3ExprDelete(pParse->db, pList->a[pCol->iDflt-1].pExpr);
    pList->a[pCol->iDflt-1].pExpr = pExpr;
  }
}